

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void InitOrLoadWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  
  IVar5 = ((*(GImGui->Viewports).Data)->super_ImGuiViewport).Pos;
  IVar4.x = IVar5.x + 60.0;
  IVar4.y = IVar5.y + 60.0;
  window->Pos = IVar4;
  (window->Size).x = 0.0;
  (window->Size).y = 0.0;
  (window->SizeFull).x = 0.0;
  (window->SizeFull).y = 0.0;
  *(uint *)&window->field_0xf0 = (uint)(byte)window->field_0xf3 << 0x18 | 0xf0f0f;
  if (settings != (ImGuiWindowSettings *)0x0) {
    SetWindowConditionAllowFlags(window,4,false);
    auVar7 = pshuflw(ZEXT416((uint)settings->Pos),ZEXT416((uint)settings->Pos),0x60);
    IVar5.x = (float)(auVar7._0_4_ >> 0x10);
    IVar5.y = (float)(auVar7._4_4_ >> 0x10);
    window->Pos = IVar5;
    uVar1 = (settings->Size).x;
    if ((0 < (short)uVar1) && (uVar2 = (settings->Size).y, 0 < (short)uVar2)) {
      IVar6.x = (float)uVar1;
      IVar6.y = (float)uVar2;
      window->Size = IVar6;
      window->SizeFull = IVar6;
    }
    window->Collapsed = settings->Collapsed;
  }
  IVar5 = window->Pos;
  (window->DC).IdealMaxPos = IVar5;
  (window->DC).CursorMaxPos = IVar5;
  (window->DC).CursorStartPos = IVar5;
  if ((window->Flags & 0x40) == 0) {
    if ((window->Size).x <= 0.0) {
      window->AutoFitFramesX = '\x02';
    }
    if ((window->Size).y <= 0.0) {
      window->AutoFitFramesY = '\x02';
    }
    bVar3 = true;
    if (window->AutoFitFramesX < '\x01') {
      bVar3 = '\0' < window->AutoFitFramesY;
    }
  }
  else {
    window->AutoFitFramesX = '\x02';
    window->AutoFitFramesY = '\x02';
    bVar3 = false;
  }
  window->AutoFitOnlyGrows = bVar3;
  return;
}

Assistant:

static void InitOrLoadWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    // Initial window state with e.g. default/arbitrary window position
    // Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    window->Pos = main_viewport->Pos + ImVec2(60, 60);
    window->Size = window->SizeFull = ImVec2(0, 0);
    window->SetWindowPosAllowFlags = window->SetWindowSizeAllowFlags = window->SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;

    if (settings != NULL)
    {
        SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
        ApplyWindowSettings(window, settings);
    }
    window->DC.CursorStartPos = window->DC.CursorMaxPos = window->DC.IdealMaxPos = window->Pos; // So first call to CalcWindowContentSizes() doesn't return crazy values

    if ((window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }
}